

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

int __thiscall smf::MidiFile::linkNotePairsLIFO(MidiFile *this)

{
  int iVar1;
  pointer ppMVar2;
  int iVar3;
  long lVar4;
  
  ppMVar2 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3) < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      if (ppMVar2[lVar4] != (MidiEventList *)0x0) {
        iVar1 = MidiEventList::linkNotePairsLIFO(ppMVar2[lVar4]);
        iVar3 = iVar3 + iVar1;
      }
      lVar4 = lVar4 + 1;
      ppMVar2 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(this->m_events).
                                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2)
                          >> 3));
  }
  this->m_linkedEventsQ = true;
  return iVar3;
}

Assistant:

int MidiFile::linkNotePairsLIFO(void) {
	int i;
	int sum = 0;
	for (i=0; i<getTrackCount(); i++) {
		if (m_events[i] == NULL) {
			continue;
		}
		sum += m_events[i]->linkNotePairsLIFO();
	}
	m_linkedEventsQ = true;
	return sum;
}